

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVector<ImVec2> *this_00;
  ImVec2 *pIVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  this_00 = &this->_Path;
  pIVar1 = ImVector<ImVec2>::back(this_00);
  local_48 = *pIVar1;
  if (num_segments == 0) {
    PathBezierToCasteljau
              (this_00,local_48.x,local_48.y,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
               this->_Data->CurveTessellationTol,0);
  }
  else {
    iVar2 = 0;
    if (0 < num_segments) {
      iVar2 = num_segments;
    }
    uStack_40 = 0;
    for (iVar3 = 1; iVar3 - iVar2 != 1; iVar3 = iVar3 + 1) {
      fVar5 = (float)iVar3 * (1.0 / (float)num_segments);
      fVar6 = 1.0 - fVar5;
      fVar4 = fVar6 * fVar6 * fVar6;
      fVar7 = fVar6 * fVar6 * 3.0 * fVar5;
      fVar6 = fVar6 * 3.0 * fVar5 * fVar5;
      fVar5 = fVar5 * fVar5 * fVar5;
      local_50.y = fVar5 * (*p4).y + fVar6 * (*p3).y + fVar4 * local_48.y + fVar7 * (*p2).y;
      local_50.x = fVar5 * (*p4).x + fVar6 * (*p3).x + fVar4 * local_48.x + fVar7 * (*p2).x;
      ImVector<ImVec2>::push_back(this_00,&local_50);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        // Auto-tessellated
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0);
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
        {
            float t = t_step * i_step;
            float u = 1.0f - t;
            float w1 = u*u*u;
            float w2 = 3*u*u*t;
            float w3 = 3*u*t*t;
            float w4 = t*t*t;
            _Path.push_back(ImVec2(w1*p1.x + w2*p2.x + w3*p3.x + w4*p4.x, w1*p1.y + w2*p2.y + w3*p3.y + w4*p4.y));
        }
    }
}